

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLEventsSourceTests.cpp
# Opt level: O2

void __thiscall
solitaire::events::SDLEventsSourceTests_returnMouseMoveEvent_Test::
SDLEventsSourceTests_returnMouseMoveEvent_Test(SDLEventsSourceTests_returnMouseMoveEvent_Test *this)

{
  SDLEventsSourceTests::SDLEventsSourceTests(&this->super_SDLEventsSourceTests);
  (this->super_SDLEventsSourceTests).super_Test._vptr_Test =
       (_func_int **)&PTR__SDLEventsSourceTests_002f4ee0;
  return;
}

Assistant:

TEST_F(SDLEventsSourceTests, returnMouseMoveEvent) {
    EXPECT_CALL(*sdlMock, pollEvent(_)).WillOnce(Invoke([](auto& event) {
        event.type = SDL_MOUSEMOTION;
        event.motion.x = x;
        event.motion.y = y;
        return 1;
    }));

    MouseMove mouseMove {x, y};
    EXPECT_EQ(std::get<MouseMove>(eventsSource.getEvent()), mouseMove);
}